

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O1

void __thiscall Color::Color(Color *this,double red,double green,double blue)

{
  uchar uVar1;
  int iVar2;
  uchar uVar3;
  int iVar4;
  uchar uVar5;
  uchar uVar6;
  
  iVar2 = (int)red;
  iVar4 = (int)green;
  if (0xfe < iVar2) {
    iVar2 = 0xff;
  }
  uVar6 = '\0';
  uVar1 = (uchar)iVar2;
  if (iVar2 < 1) {
    uVar1 = uVar6;
  }
  if (0xfe < iVar4) {
    iVar4 = 0xff;
  }
  uVar3 = (uchar)iVar4;
  if (iVar4 < 1) {
    uVar3 = uVar6;
  }
  iVar2 = 0xff;
  if ((int)blue < 0xff) {
    iVar2 = (int)blue;
  }
  uVar5 = (uchar)iVar2;
  if (iVar2 < 1) {
    uVar5 = uVar6;
  }
  this->r = uVar1;
  this->g = uVar3;
  this->b = uVar5;
  return;
}

Assistant:

Color::Color(double red, double green, double blue) {
    int r,g,b;
    r = red;
    g = green;
    b = blue;
    clamp(r, g, b);

    this->r = r;
    this->g = g;
    this->b = b;

}